

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rowSetTreeToList(RowSetEntry *pIn,RowSetEntry **ppFirst,RowSetEntry **ppLast)

{
  RowSetEntry *local_28;
  RowSetEntry *p;
  RowSetEntry **ppLast_local;
  RowSetEntry **ppFirst_local;
  RowSetEntry *pIn_local;
  
  p = (RowSetEntry *)ppLast;
  ppLast_local = ppFirst;
  ppFirst_local = (RowSetEntry **)pIn;
  if (pIn->pLeft == (RowSetEntry *)0x0) {
    *ppFirst = pIn;
  }
  else {
    rowSetTreeToList(pIn->pLeft,ppFirst,&local_28);
    local_28->pRight = (RowSetEntry *)ppFirst_local;
  }
  if (ppFirst_local[1] == (RowSetEntry *)0x0) {
    p->v = (i64)ppFirst_local;
  }
  else {
    rowSetTreeToList(ppFirst_local[1],ppFirst_local + 1,(RowSetEntry **)p);
  }
  return;
}

Assistant:

static void rowSetTreeToList(
  struct RowSetEntry *pIn,         /* Root of the input tree */
  struct RowSetEntry **ppFirst,    /* Write head of the output list here */
  struct RowSetEntry **ppLast      /* Write tail of the output list here */
){
  assert( pIn!=0 );
  if( pIn->pLeft ){
    struct RowSetEntry *p;
    rowSetTreeToList(pIn->pLeft, ppFirst, &p);
    p->pRight = pIn;
  }else{
    *ppFirst = pIn;
  }
  if( pIn->pRight ){
    rowSetTreeToList(pIn->pRight, &pIn->pRight, ppLast);
  }else{
    *ppLast = pIn;
  }
  assert( (*ppLast)->pRight==0 );
}